

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O2

bool __thiscall
Memory::X64WriteBarrierCardTableManager::OnThreadInit(X64WriteBarrierCardTableManager *this)

{
  bool bVar1;
  char *local_30;
  ULONG_PTR stackBase;
  ULONG_PTR stackEnd;
  
  local_30 = (char *)0x0;
  stackBase = 0;
  GetCurrentThreadStackLimits(&stackBase,(ULONG_PTR *)&local_30);
  this->_stackbase = local_30;
  this->_stacklimit = (char *)stackBase;
  bVar1 = OnSegmentAlloc(this,(char *)stackBase,(long)local_30 - stackBase >> 0xc);
  RecyclerWriteBarrierManager::ToggleBarrier((void *)stackBase,(long)local_30 - stackBase,true);
  return bVar1;
}

Assistant:

bool
X64WriteBarrierCardTableManager::OnThreadInit()
{
    // We page in the card table sections for the current threads stack reservation
    // So any writes to stack allocated vars can also have the write barrier set

    // ToDo (SaAgarwa) __readgsqword is not on ARM64?
    // xplat-todo: Replace this on Windows too with GetCurrentThreadStackBounds
#if defined(_WIN32) && defined(_M_X64) && !defined(_M_ARM64)
    // check StackProber.cpp for the stack pages layout information
    NT_TIB* teb = (NT_TIB*) ::NtCurrentTeb();
    char* stackBase = (char*) teb->StackBase;
    char* stackEnd = (char*)__readgsqword(0x1478); // 0x1478 is offset of DeallocationStack field on ntdll!_TEB on x64
                                                   // this is undocumented, verifying with following code
#if DBG
    MEMORY_BASIC_INFORMATION memInfo;
    VirtualQuery((LPCVOID)teb->StackLimit, &memInfo, sizeof(memInfo));
    Assert((char*)memInfo.AllocationBase == stackEnd);
    Assert(memInfo.AllocationProtect == PAGE_READWRITE);
#endif // DBG
#else // defined(_WIN32) && defined(_M_X64) && !defined(_M_ARM64)
    ULONG_PTR stackBase = 0;
    ULONG_PTR stackEnd = 0;
    ::GetCurrentThreadStackLimits(&stackEnd, &stackBase);
#endif // defined(_WIN32) && defined(_M_X64) && !defined(_M_ARM64)

#ifdef X64_WB_DIAG
    this->_stackbase = (char*)stackBase;
    this->_stacklimit = (char*)stackEnd;
#endif

    size_t numPages = (stackBase - stackEnd) / AutoSystemInfo::PageSize;
    // stackEnd is the lower boundary
    bool ret = OnSegmentAlloc((char*) stackEnd, numPages);
#if ENABLE_DEBUG_CONFIG_OPTIONS
    RecyclerWriteBarrierManager::ToggleBarrier((char*)stackEnd, (stackBase - stackEnd), true);
#endif
    return ret;
}